

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrbmp.c
# Opt level: O0

void put_pixel_rows(j_decompress_ptr cinfo,djpeg_dest_ptr dinfo,JDIMENSION rows_supplied)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ushort uVar7;
  ushort uVar8;
  undefined8 *puVar9;
  byte *pbVar10;
  long in_RSI;
  long in_RDI;
  int ps;
  int bindex;
  int gindex;
  int rindex;
  JSAMPLE k;
  JSAMPLE y;
  JSAMPLE m;
  JSAMPLE c;
  unsigned_short *inptr2;
  boolean big_endian;
  int pad;
  JDIMENSION col;
  JSAMPROW outptr;
  JSAMPROW inptr;
  JSAMPARRAY image_ptr;
  bmp_dest_ptr dest;
  int test_value;
  ushort *local_78;
  int local_68;
  int local_64;
  byte *local_60;
  ushort *local_58;
  
  if (*(int *)(in_RSI + 0x58) == 0) {
    local_60 = *(byte **)(in_RSI + 0x60);
  }
  else {
    puVar9 = (undefined8 *)
             (**(code **)(*(long *)(in_RDI + 8) + 0x38))
                       (in_RDI,*(undefined8 *)(in_RSI + 0x40),*(undefined4 *)(in_RSI + 0x54),1);
    *(int *)(in_RSI + 0x54) = *(int *)(in_RSI + 0x54) + 1;
    local_60 = (byte *)*puVar9;
  }
  local_78 = (ushort *)**(undefined8 **)(in_RSI + 0x28);
  if (*(int *)(in_RDI + 0x40) == 8) {
    memcpy(local_60,local_78,(ulong)*(uint *)(in_RSI + 0x4c));
    local_60 = local_60 + (uint)(*(int *)(in_RDI + 0x88) * 3);
  }
  else if (*(int *)(in_RDI + 0x40) == 0x10) {
    for (local_64 = *(int *)(in_RDI + 0x88); local_64 != 0; local_64 = local_64 + -1) {
      *local_60 = (char)*local_78 << 3;
      local_60[1] = (byte)((int)(uint)*local_78 >> 3) & 0xfc;
      local_60[2] = (byte)(*local_78 >> 8) & 0xf8;
      local_60 = local_60 + 3;
      local_78 = local_78 + 1;
    }
  }
  else {
    local_58 = local_78;
    if (*(int *)(in_RDI + 0x40) == 4) {
      for (local_64 = *(int *)(in_RDI + 0x88); local_64 != 0; local_64 = local_64 + -1) {
        uVar7 = *local_58;
        bVar1 = *(byte *)((long)local_58 + 1);
        pbVar10 = (byte *)((long)local_58 + 3);
        uVar8 = local_58[1];
        local_58 = local_58 + 2;
        bVar2 = *pbVar10;
        local_60[2] = (byte)(int)(((double)(byte)uVar7 * (double)bVar2) / 255.0 + 0.5);
        local_60[1] = (byte)(int)(((double)bVar1 * (double)bVar2) / 255.0 + 0.5);
        *local_60 = (byte)(int)(((double)(byte)uVar8 * (double)bVar2) / 255.0 + 0.5);
        local_60 = local_60 + 3;
      }
    }
    else {
      iVar3 = rgb_red[*(uint *)(in_RDI + 0x40)];
      iVar4 = rgb_green[*(uint *)(in_RDI + 0x40)];
      iVar5 = rgb_blue[*(uint *)(in_RDI + 0x40)];
      iVar6 = rgb_pixelsize[*(uint *)(in_RDI + 0x40)];
      for (local_64 = *(int *)(in_RDI + 0x88); local_64 != 0; local_64 = local_64 + -1) {
        *local_60 = *(byte *)((long)local_58 + (long)iVar5);
        local_60[1] = *(byte *)((long)local_58 + (long)iVar4);
        local_60[2] = *(byte *)((long)local_58 + (long)iVar3);
        local_60 = local_60 + 3;
        local_58 = (ushort *)((long)local_58 + (long)iVar6);
      }
    }
  }
  local_68 = *(int *)(in_RSI + 0x50);
  while (local_68 = local_68 + -1, -1 < local_68) {
    *local_60 = 0;
    local_60 = local_60 + 1;
  }
  if (*(int *)(in_RSI + 0x58) == 0) {
    fwrite(*(void **)(in_RSI + 0x60),1,(ulong)*(uint *)(in_RSI + 0x4c),*(FILE **)(in_RSI + 0x20));
  }
  return;
}

Assistant:

METHODDEF(void)
put_pixel_rows(j_decompress_ptr cinfo, djpeg_dest_ptr dinfo,
               JDIMENSION rows_supplied)
/* This version is for writing 24-bit pixels */
{
  bmp_dest_ptr dest = (bmp_dest_ptr)dinfo;
  JSAMPARRAY image_ptr;
  register JSAMPROW inptr, outptr;
  register JDIMENSION col;
  int pad;

  if (dest->use_inversion_array) {
    /* Access next row in virtual array */
    image_ptr = (*cinfo->mem->access_virt_sarray)
      ((j_common_ptr)cinfo, dest->whole_image,
       dest->cur_output_row, (JDIMENSION)1, TRUE);
    dest->cur_output_row++;
    outptr = image_ptr[0];
  } else {
    outptr = dest->iobuffer;
  }

  /* Transfer data.  Note destination values must be in BGR order
   * (even though Microsoft's own documents say the opposite).
   */
  inptr = dest->pub.buffer[0];

  if (cinfo->out_color_space == JCS_EXT_BGR) {
    MEMCOPY(outptr, inptr, dest->row_width);
    outptr += cinfo->output_width * 3;
  } else if (cinfo->out_color_space == JCS_RGB565) {
    boolean big_endian = is_big_endian();
    unsigned short *inptr2 = (unsigned short *)inptr;
    for (col = cinfo->output_width; col > 0; col--) {
      if (big_endian) {
        outptr[0] = (*inptr2 >> 5) & 0xF8;
        outptr[1] = ((*inptr2 << 5) & 0xE0) | ((*inptr2 >> 11) & 0x1C);
        outptr[2] = *inptr2 & 0xF8;
      } else {
        outptr[0] = (*inptr2 << 3) & 0xF8;
        outptr[1] = (*inptr2 >> 3) & 0xFC;
        outptr[2] = (*inptr2 >> 8) & 0xF8;
      }
      outptr += 3;
      inptr2++;
    }
  } else if (cinfo->out_color_space == JCS_CMYK) {
    for (col = cinfo->output_width; col > 0; col--) {
      JSAMPLE c = *inptr++, m = *inptr++, y = *inptr++, k = *inptr++;
      cmyk_to_rgb(c, m, y, k, outptr + 2, outptr + 1, outptr);
      outptr += 3;
    }
  } else {
    register int rindex = rgb_red[cinfo->out_color_space];
    register int gindex = rgb_green[cinfo->out_color_space];
    register int bindex = rgb_blue[cinfo->out_color_space];
    register int ps = rgb_pixelsize[cinfo->out_color_space];

    for (col = cinfo->output_width; col > 0; col--) {
      outptr[0] = inptr[bindex];
      outptr[1] = inptr[gindex];
      outptr[2] = inptr[rindex];
      outptr += 3;  inptr += ps;
    }
  }

  /* Zero out the pad bytes. */
  pad = dest->pad_bytes;
  while (--pad >= 0)
    *outptr++ = 0;

  if (!dest->use_inversion_array)
    (void)JFWRITE(dest->pub.output_file, dest->iobuffer, dest->row_width);
}